

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_json
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,bool as_key,bool use_quotes)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  error_flags eVar4;
  int iVar5;
  size_t sVar6;
  undefined7 in_register_00000009;
  size_t sVar7;
  char *pcVar8;
  undefined3 in_register_00000081;
  ulong uVar9;
  ulong uVar10;
  csubstr sp;
  csubstr s_local;
  csubstr local_40;
  
  sVar7 = s.len;
  pcVar8 = s.str;
  s_local.str = pcVar8;
  s_local.len = sVar7;
  if (((int)CONCAT71(in_register_00000009,as_key) == 0 &&
       CONCAT31(in_register_00000081,use_quotes) == 0) &&
     ((((iVar5 = basic_substring<const_char>::compare(&s_local,"true",4), iVar5 == 0 ||
        (iVar5 = basic_substring<const_char>::compare(&s_local,"false",5), iVar5 == 0)) ||
       (iVar5 = basic_substring<const_char>::compare(&s_local,"null",4), iVar5 == 0)) ||
      ((bVar3 = basic_substring<const_char>::is_number(&s_local), bVar3 &&
       (((sVar7 = s_local.len, pcVar8 = s_local.str, s_local.len < 2 || (*s_local.str != '0')) ||
        (sVar6 = basic_substring<const_char>::first_of(&s_local,'.',0), sVar7 = s_local.len,
        pcVar8 = s_local.str, sVar6 != 0xffffffffffffffff)))))))) {
    sp.len = sVar7;
    sp.str = pcVar8;
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,sp);
  }
  else {
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,'\"');
    uVar10 = 0;
    uVar9 = 0;
LAB_001997d3:
    while (uVar9 < s_local.len) {
      cVar1 = s_local.str[uVar9];
      switch(cVar1) {
      case '\b':
        if (s_local.len < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        if (uVar9 < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (s_local.len < uVar9) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_40,s_local.str + uVar10,uVar9 - uVar10);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,local_40);
        pcVar8 = "\\b";
        break;
      case '\t':
        if (s_local.len < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        if (uVar9 < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (s_local.len < uVar9) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_40,s_local.str + uVar10,uVar9 - uVar10);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,local_40);
        pcVar8 = "\\t";
        break;
      case '\n':
        if (s_local.len < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        if (uVar9 < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (s_local.len < uVar9) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_40,s_local.str + uVar10,uVar9 - uVar10);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,local_40);
        pcVar8 = "\\n";
        break;
      case '\v':
        goto switchD_001997fb_caseD_b;
      case '\f':
        if (s_local.len < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        if (uVar9 < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (s_local.len < uVar9) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_40,s_local.str + uVar10,uVar9 - uVar10);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,local_40);
        pcVar8 = "\\f";
        break;
      case '\r':
        if (s_local.len < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1544,"first >= 0 && first <= len");
        }
        if (uVar9 < uVar10) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1546,"first <= last");
        }
        if (s_local.len < uVar9) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          handle_error(0x1e7ac6,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1547,"last >= 0 && last <= len");
        }
        basic_substring<const_char>::basic_substring(&local_40,s_local.str + uVar10,uVar9 - uVar10);
        WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,local_40);
        pcVar8 = "\\r";
        break;
      default:
        if (cVar1 == '\"') {
          if (s_local.len < uVar10) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar9 < uVar10) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (s_local.len < uVar9) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_40,s_local.str + uVar10,uVar9 - uVar10);
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,local_40);
          pcVar8 = "\\\"";
        }
        else {
          if (cVar1 != '\\') goto switchD_001997fb_caseD_b;
          if (s_local.len < uVar10) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar9 < uVar10) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (s_local.len < uVar9) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1e7ac6,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_40,s_local.str + uVar10,uVar9 - uVar10);
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,local_40);
          pcVar8 = "\\\\";
        }
      }
      WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                ((WriterOStream<std::__cxx11::ostringstream> *)this,(char (*) [3])pcVar8);
      uVar10 = uVar9 + 1;
      uVar9 = uVar10;
    }
    if (uVar10 <= s_local.len && s_local.len - uVar10 != 0) {
      basic_substring<const_char>::basic_substring
                (&local_40,s_local.str + uVar10,s_local.len - uVar10);
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,local_40);
    }
    WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_do_write(&this->
                 super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ,'\"');
  }
  return;
switchD_001997fb_caseD_b:
  uVar9 = uVar9 + 1;
  goto LAB_001997d3;
}

Assistant:

void Emitter<Writer>::_write_scalar_json(csubstr s, bool as_key, bool use_quotes)
{
    if((!use_quotes)
       // json keys require quotes
       && (!as_key)
       && (
           // do not quote special cases
           (s == "true" || s == "false" || s == "null")
           || (
               // do not quote numbers
               (s.is_number()
                && (
                    // quote integral numbers if they have a leading 0
                    // https://github.com/biojppm/rapidyaml/issues/291
                    (!(s.len > 1 && s.begins_with('0')))
                    // do not quote reals with leading 0
                    // https://github.com/biojppm/rapidyaml/issues/313
                    || (s.find('.') != csubstr::npos) ))
               )
           )
        )
    {
        this->Writer::_do_write(s);
    }
    else
    {
        size_t pos = 0;
        this->Writer::_do_write('"');
        for(size_t i = 0; i < s.len; ++i)
        {
            switch(s.str[i])
            {
            case '"':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\\"");
              pos = i + 1;
              break;
            case '\n':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\n");
              pos = i + 1;
              break;
            case '\t':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\t");
              pos = i + 1;
              break;
            case '\\':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\\\");
              pos = i + 1;
              break;
            case '\r':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\r");
              pos = i + 1;
              break;
            case '\b':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\b");
              pos = i + 1;
              break;
            case '\f':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\f");
              pos = i + 1;
              break;
            }
        }
        if(pos < s.len)
        {
            csubstr sub = s.sub(pos);
            this->Writer::_do_write(sub);
        }
        this->Writer::_do_write('"');
    }
}